

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O2

void __thiscall license::hw_identifier::HwIdentifier::HwIdentifier(HwIdentifier *this,string *param)

{
  logic_error *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string tmp_str;
  
  this->_vptr_HwIdentifier = (_func_int **)&PTR__HwIdentifier_004b1028;
  *(undefined8 *)(this->m_data)._M_elems = 0;
  std::__cxx11::string::string((string *)&tmp_str,(string *)param);
  local_60._M_dataplus._M_p._0_1_ = 0x2d;
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 10;
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )tmp_str._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(tmp_str._M_dataplus._M_p + tmp_str._M_string_length),(char *)&local_60,
             (char *)&decoded);
  unbase64(&decoded,&tmp_str);
  if ((long)decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)CONCAT71(decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                     decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_1_) == 8) {
    *(undefined8 *)(this->m_data)._M_elems =
         *(undefined8 *)
          CONCAT71(decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start._1_7_,
                   decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start._0_1_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::~string((string *)&tmp_str);
    return;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"wrong identifier size ",param);
  std::logic_error::logic_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

HwIdentifier::HwIdentifier(const std::string& param) {
	string tmp_str(param);  // throw away const
	std::replace(tmp_str.begin(), tmp_str.end(), '-', '\n');
	vector<uint8_t> decoded = unbase64(tmp_str);
	if (decoded.size() != HW_IDENTIFIER_PROPRIETARY_DATA + 1) {
		cerr << decoded.size();
		throw logic_error("wrong identifier size " + param);
	}
	std::copy_n(decoded.begin(), HW_IDENTIFIER_PROPRIETARY_DATA + 1, m_data.begin());
}